

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_1::checkPointSizeRequirements
               (InstanceInterface *vki,VkPhysicalDevice physDevice,int maxPointSize)

{
  NotSupportedError *this;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  VkPhysicalDeviceProperties properties;
  int maxPointSize_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  
  properties._820_4_ = maxPointSize;
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_358,vki,physDevice);
  if ((int)(float)properties.limits.discreteQueuePriorities < (int)properties._820_4_) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_398,(int *)&properties.field_0x334);
    std::operator+(&local_378,"Test requires point size ",&local_398);
    tcu::NotSupportedError::NotSupportedError(this,&local_378);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  return;
}

Assistant:

void checkPointSizeRequirements (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const int maxPointSize)
{
	const VkPhysicalDeviceProperties properties = getPhysicalDeviceProperties(vki, physDevice);
	if (maxPointSize > static_cast<int>(properties.limits.pointSizeRange[1]))
		throw tcu::NotSupportedError("Test requires point size " + de::toString(maxPointSize));
	// Point size granularity must be 1.0 at most, so no need to check it for this test.
}